

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

string * relive::stripTypeName(string *__return_storage_ptr__,string *classname)

{
  string *classname_local;
  
  demangle(__return_storage_ptr__,classname);
  return __return_storage_ptr__;
}

Assistant:

std::string stripTypeName(const std::string& classname)
{
#ifdef _WIN32
    std::string::size_type pos1 = classname.find_first_of(" ");
    std::string::size_type pos3 = classname.find_last_of(">");
    if(pos3 != std::string::npos)
    {
        return classname.substr(pos1+1, (pos3 - pos1));
    }
    std::string::size_type pos2 = classname.find_last_of(" ");
    return classname.substr(pos1+1, (pos2 - pos1)-1);
#else
    return demangle(classname);
#endif
}